

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O0

void test_dict_basic(void)

{
  int iVar1;
  VALUE_TYPE VVar2;
  VALUE *pVVar3;
  size_t sVar4;
  VALUE *pVVar5;
  VALUE *pVVar6;
  VALUE *pVVar7;
  char *pcVar8;
  VALUE *keys [8];
  VALUE *baz;
  VALUE *bar;
  VALUE *foo;
  VALUE d;
  void *in_stack_000003b8;
  VALUE *in_stack_000003c0;
  VALUE *in_stack_000003c8;
  VALUE *in_stack_ffffffffffffff98;
  VALUE *in_stack_ffffffffffffffa8;
  VALUE *in_stack_ffffffffffffffb0;
  VALUE *in_stack_ffffffffffffffb8;
  VALUE_TYPE in_stack_fffffffffffffff4;
  VALUE *in_stack_fffffffffffffff8;
  
  iVar1 = value_init_dict((VALUE *)0x10ba4d);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x305,"%s","value_init_dict(NULL) != 0");
  pVVar3 = value_dict_get(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  acutest_check_((int)(ulong)(pVVar3 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x306,"%s","value_dict_get(NULL, \"foo\") == NULL");
  pVVar3 = value_dict_get_or_add(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  acutest_check_((int)(ulong)(pVVar3 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x307,"%s","value_dict_get_or_add(NULL, \"foo\") == NULL");
  iVar1 = value_dict_remove(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x308,"%s","value_dict_remove(NULL, \"foo\") != 0");
  iVar1 = value_dict_walk_ordered
                    (in_stack_ffffffffffffffb8,
                     (_func_int_VALUE_ptr_VALUE_ptr_void_ptr *)in_stack_ffffffffffffffb0,
                     in_stack_ffffffffffffffa8);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x309,"%s","value_dict_walk_ordered(NULL, NULL, NULL) != 0");
  iVar1 = value_dict_walk_sorted
                    (in_stack_000003c8,(_func_int_VALUE_ptr_VALUE_ptr_void_ptr *)in_stack_000003c0,
                     in_stack_000003b8);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x30a,"%s","value_dict_walk_sorted(NULL, NULL, NULL) != 0");
  value_dict_clean(in_stack_000003c0);
  value_init_dict((VALUE *)0x10bbd0);
  VVar2 = value_type((VALUE *)&stack0xfffffffffffffff0);
  acutest_check_((int)(ulong)(VVar2 == VALUE_DICT),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x30e,"%s","value_type(&d) == VALUE_DICT");
  iVar1 = value_is_compatible(in_stack_fffffffffffffff8,in_stack_fffffffffffffff4);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x30f,"%s","!value_is_compatible(&d, VALUE_NULL)");
  iVar1 = value_is_compatible(in_stack_fffffffffffffff8,in_stack_fffffffffffffff4);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x310,"%s","!value_is_compatible(&d, VALUE_BOOL)");
  iVar1 = value_is_compatible(in_stack_fffffffffffffff8,in_stack_fffffffffffffff4);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x311,"%s","!value_is_compatible(&d, VALUE_INT32)");
  iVar1 = value_is_compatible(in_stack_fffffffffffffff8,in_stack_fffffffffffffff4);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x312,"%s","!value_is_compatible(&d, VALUE_UINT32)");
  iVar1 = value_is_compatible(in_stack_fffffffffffffff8,in_stack_fffffffffffffff4);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x313,"%s","!value_is_compatible(&d, VALUE_INT64)");
  iVar1 = value_is_compatible(in_stack_fffffffffffffff8,in_stack_fffffffffffffff4);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x314,"%s","!value_is_compatible(&d, VALUE_UINT64)");
  iVar1 = value_is_compatible(in_stack_fffffffffffffff8,in_stack_fffffffffffffff4);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x315,"%s","!value_is_compatible(&d, VALUE_FLOAT)");
  iVar1 = value_is_compatible(in_stack_fffffffffffffff8,in_stack_fffffffffffffff4);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x316,"%s","!value_is_compatible(&d, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(in_stack_fffffffffffffff8,in_stack_fffffffffffffff4);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x317,"%s","!value_is_compatible(&d, VALUE_ARRAY)");
  iVar1 = value_is_compatible(in_stack_fffffffffffffff8,in_stack_fffffffffffffff4);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x318,"%s","value_is_compatible(&d, VALUE_DICT)");
  pVVar3 = value_dict_get(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  acutest_check_((int)(ulong)(pVVar3 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x319,"%s","value_dict_get(&d, \"n/a\") == NULL");
  sVar4 = value_dict_size(in_stack_ffffffffffffff98);
  acutest_check_((int)(ulong)(sVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x31a,"%s","value_dict_size(&d) == 0");
  pVVar3 = value_dict_get_or_add(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  acutest_check_((int)(ulong)(pVVar3 != (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x31b,"%s","value_dict_get_or_add(&d, \"new\") != NULL");
  sVar4 = value_dict_size(in_stack_ffffffffffffff98);
  acutest_check_((int)(ulong)(sVar4 == 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x31c,"%s","value_dict_size(&d) == 1");
  value_dict_clean(in_stack_000003c0);
  sVar4 = value_dict_size(in_stack_ffffffffffffff98);
  acutest_check_((int)(ulong)(sVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x31e,"%s","value_dict_size(&d) == 0");
  value_fini((VALUE *)0x10bfd8);
  value_init_dict((VALUE *)0x10bfe2);
  pVVar3 = value_dict_get_or_add(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  value_init_string(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  pVVar5 = value_dict_get_or_add(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  value_init_string(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  pVVar6 = value_dict_get_or_add(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  value_init_string(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  sVar4 = value_dict_size(in_stack_ffffffffffffff98);
  acutest_check_((int)(ulong)(sVar4 == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x328,"%s","value_dict_size(&d) == 3");
  pVVar7 = value_dict_get(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  acutest_check_((int)(ulong)(pVVar7 == pVVar3),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x329,"%s","value_dict_get(&d, \"foo\") == foo");
  pVVar7 = value_dict_get(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  acutest_check_((int)(ulong)(pVVar7 == pVVar5),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x32a,"%s","value_dict_get(&d, \"bar\") == bar");
  pVVar7 = value_dict_get(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  acutest_check_((int)(ulong)(pVVar7 == pVVar6),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x32b,"%s","value_dict_get(&d, \"baz\") == baz");
  pVVar7 = value_dict_get(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  acutest_check_((int)(ulong)(pVVar7 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x32c,"%s","value_dict_get(&d, \"n/a\") == NULL");
  pVVar7 = value_dict_get_or_add(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  acutest_check_((int)(ulong)(pVVar7 == pVVar3),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x32d,"%s","value_dict_get_or_add(&d, \"foo\") == foo");
  pVVar3 = value_dict_get_or_add(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  acutest_check_((int)(ulong)(pVVar3 == pVVar5),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x32e,"%s","value_dict_get_or_add(&d, \"bar\") == bar");
  pVVar3 = value_dict_get_or_add(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  acutest_check_((int)(ulong)(pVVar3 == pVVar6),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x32f,"%s","value_dict_get_or_add(&d, \"baz\") == baz");
  sVar4 = value_dict_keys_sorted
                    (in_stack_000003c8,(VALUE **)in_stack_000003c0,(size_t)in_stack_000003b8);
  acutest_check_((int)(ulong)(sVar4 == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x331,"%s","value_dict_keys_sorted(&d, keys, 8) == 3");
  pcVar8 = value_string(in_stack_ffffffffffffffa8);
  iVar1 = strcmp(pcVar8,"bar");
  acutest_check_((int)(ulong)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x332,"%s","strcmp(value_string(keys[0]), \"bar\") == 0");
  pcVar8 = value_string(in_stack_ffffffffffffffa8);
  iVar1 = strcmp(pcVar8,"baz");
  acutest_check_((int)(ulong)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x333,"%s","strcmp(value_string(keys[1]), \"baz\") == 0");
  pcVar8 = value_string(in_stack_ffffffffffffffa8);
  iVar1 = strcmp(pcVar8,"foo");
  acutest_check_((int)(ulong)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x334,"%s","strcmp(value_string(keys[2]), \"foo\") == 0");
  value_fini((VALUE *)0x10c38d);
  return;
}

Assistant:

static void
test_dict_basic(void)
{
    VALUE d;
    VALUE* foo;
    VALUE* bar;
    VALUE* baz;
    const VALUE* keys[8];

    TEST_CHECK(value_init_dict(NULL) != 0);
    TEST_CHECK(value_dict_get(NULL, "foo") == NULL);
    TEST_CHECK(value_dict_get_or_add(NULL, "foo") == NULL);
    TEST_CHECK(value_dict_remove(NULL, "foo") != 0);
    TEST_CHECK(value_dict_walk_ordered(NULL, NULL, NULL) != 0);
    TEST_CHECK(value_dict_walk_sorted(NULL, NULL, NULL) != 0);
    value_dict_clean(NULL);

    value_init_dict(&d);
    TEST_CHECK(value_type(&d) == VALUE_DICT);
    TEST_CHECK(!value_is_compatible(&d, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&d, VALUE_BOOL));
    TEST_CHECK(!value_is_compatible(&d, VALUE_INT32));
    TEST_CHECK(!value_is_compatible(&d, VALUE_UINT32));
    TEST_CHECK(!value_is_compatible(&d, VALUE_INT64));
    TEST_CHECK(!value_is_compatible(&d, VALUE_UINT64));
    TEST_CHECK(!value_is_compatible(&d, VALUE_FLOAT));
    TEST_CHECK(!value_is_compatible(&d, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(&d, VALUE_ARRAY));
    TEST_CHECK(value_is_compatible(&d, VALUE_DICT));
    TEST_CHECK(value_dict_get(&d, "n/a") == NULL);
    TEST_CHECK(value_dict_size(&d) == 0);
    TEST_CHECK(value_dict_get_or_add(&d, "new") != NULL);
    TEST_CHECK(value_dict_size(&d) == 1);
    value_dict_clean(&d);
    TEST_CHECK(value_dict_size(&d) == 0);
    value_fini(&d);

    value_init_dict(&d);
    foo = value_dict_get_or_add(&d, "foo");
    value_init_string(foo, "foo value");
    bar = value_dict_get_or_add(&d, "bar");
    value_init_string(bar, "bar value");
    baz = value_dict_get_or_add(&d, "baz");
    value_init_string(baz, "baz value");
    TEST_CHECK(value_dict_size(&d) == 3);
    TEST_CHECK(value_dict_get(&d, "foo") == foo);
    TEST_CHECK(value_dict_get(&d, "bar") == bar);
    TEST_CHECK(value_dict_get(&d, "baz") == baz);
    TEST_CHECK(value_dict_get(&d, "n/a") == NULL);
    TEST_CHECK(value_dict_get_or_add(&d, "foo") == foo);
    TEST_CHECK(value_dict_get_or_add(&d, "bar") == bar);
    TEST_CHECK(value_dict_get_or_add(&d, "baz") == baz);

    TEST_CHECK(value_dict_keys_sorted(&d, keys, 8) == 3);
    TEST_CHECK(strcmp(value_string(keys[0]), "bar") == 0);
    TEST_CHECK(strcmp(value_string(keys[1]), "baz") == 0);
    TEST_CHECK(strcmp(value_string(keys[2]), "foo") == 0);
    value_fini(&d);
}